

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O0

HeadersConfig *
jaegertracing::propagation::HeadersConfig::parse
          (HeadersConfig *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  char (*in_R8) [1];
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> traceBaggageHeaderPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> traceContextHeaderName;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jaegerBaggageHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jaegerDebugHeader;
  Node *configYAML_local;
  
  bVar1 = YAML::Node::IsDefined(configYAML);
  if ((bVar1) && (bVar1 = YAML::Node::IsMap(configYAML), bVar1)) {
    utils::yaml::findOrDefault<std::__cxx11::string,char[18],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&jaegerBaggageHeader.field_2 + 8),(yaml *)configYAML,
               (Node *)"jaegerDebugHeader",(char (*) [18])0x34afcb,in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[20],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               (yaml *)configYAML,(Node *)"jaegerBaggageHeader",(char (*) [20])0x34afcb,in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[23],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&traceBaggageHeaderPrefix.field_2 + 8),(yaml *)configYAML,
               (Node *)"TraceContextHeaderName",(char (*) [23])0x34afcb,in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[25],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (yaml *)configYAML,(Node *)"traceBaggageHeaderPrefix",(char (*) [25])0x34afcb,in_R8);
    HeadersConfig(__return_storage_ptr__,(string *)((long)&jaegerBaggageHeader.field_2 + 8),
                  (string *)local_58,(string *)((long)&traceBaggageHeaderPrefix.field_2 + 8),
                  (string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(traceBaggageHeaderPrefix.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(jaegerBaggageHeader.field_2._M_local_buf + 8));
  }
  else {
    HeadersConfig(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static HeadersConfig parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return HeadersConfig();
        }

        const auto jaegerDebugHeader = utils::yaml::findOrDefault<std::string>(
            configYAML, "jaegerDebugHeader", "");
        const auto jaegerBaggageHeader =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "jaegerBaggageHeader", "");
        const auto traceContextHeaderName =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "TraceContextHeaderName", "");
        const auto traceBaggageHeaderPrefix =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "traceBaggageHeaderPrefix", "");

        return HeadersConfig(jaegerDebugHeader,
                             jaegerBaggageHeader,
                             traceContextHeaderName,
                             traceBaggageHeaderPrefix);
    }